

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_sleep(int ms)

{
  sqlite3_vfs *pVfs_00;
  int in_EDI;
  int rc;
  sqlite3_vfs *pVfs;
  int nMicro;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  pVfs_00 = sqlite3_vfs_find((char *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffe8));
  if (pVfs_00 == (sqlite3_vfs *)0x0) {
    local_4 = 0;
  }
  else {
    if (in_EDI < 0) {
      nMicro = 0;
    }
    else {
      nMicro = in_EDI * 1000;
    }
    local_4 = sqlite3OsSleep(pVfs_00,nMicro);
    local_4 = local_4 / 1000;
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_sleep(int ms){
  sqlite3_vfs *pVfs;
  int rc;
  pVfs = sqlite3_vfs_find(0);
  if( pVfs==0 ) return 0;

  /* This function works in milliseconds, but the underlying OsSleep()
  ** API uses microseconds. Hence the 1000's.
  */
  rc = (sqlite3OsSleep(pVfs, ms<0 ? 0 : 1000*ms)/1000);
  return rc;
}